

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O1

uint32_t __thiscall
icu_63::DataBuilderCollationIterator::getCE32FromBuilderData
          (DataBuilderCollationIterator *this,uint32_t ce32,UErrorCode *errorCode)

{
  ushort uVar1;
  CollationDataBuilder *pCVar2;
  uint32_t uVar3;
  ConditionalCE32 *head;
  char16_t *pcVar4;
  
  if ((ce32 >> 8 & 1) == 0) {
    head = (ConditionalCE32 *)UVector::elementAt(&this->builder->conditionalCE32s,ce32 >> 0xd);
    if (head->builtCE32 == 1) {
      uVar3 = CollationDataBuilder::buildContext(this->builder,head,errorCode);
      head->builtCE32 = uVar3;
      if (*errorCode == U_BUFFER_OVERFLOW_ERROR) {
        *errorCode = U_ZERO_ERROR;
        CollationDataBuilder::clearContexts(this->builder);
        uVar3 = CollationDataBuilder::buildContext(this->builder,head,errorCode);
        head->builtCE32 = uVar3;
      }
      pCVar2 = this->builder;
      uVar1 = (pCVar2->contexts).fUnion.fStackFields.fLengthAndFlags;
      if ((uVar1 & 0x11) == 0) {
        if ((uVar1 & 2) == 0) {
          pcVar4 = (pCVar2->contexts).fUnion.fFields.fArray;
        }
        else {
          pcVar4 = (char16_t *)((long)&(pCVar2->contexts).fUnion + 2);
        }
      }
      else {
        pcVar4 = (char16_t *)0x0;
      }
      (this->builderData).contexts = pcVar4;
    }
    return head->builtCE32;
  }
  uVar3 = utrie2_get32_63(this->builder->trie,ce32 >> 0xd);
  return uVar3;
}

Assistant:

uint32_t
DataBuilderCollationIterator::getCE32FromBuilderData(uint32_t ce32, UErrorCode &errorCode) {
    U_ASSERT(Collation::hasCE32Tag(ce32, Collation::BUILDER_DATA_TAG));
    if((ce32 & CollationDataBuilder::IS_BUILDER_JAMO_CE32) != 0) {
        UChar32 jamo = Collation::indexFromCE32(ce32);
        return utrie2_get32(builder.trie, jamo);
    } else {
        ConditionalCE32 *cond = builder.getConditionalCE32ForCE32(ce32);
        if(cond->builtCE32 == Collation::NO_CE32) {
            // Build the context-sensitive mappings into their runtime form and cache the result.
            cond->builtCE32 = builder.buildContext(cond, errorCode);
            if(errorCode == U_BUFFER_OVERFLOW_ERROR) {
                errorCode = U_ZERO_ERROR;
                builder.clearContexts();
                cond->builtCE32 = builder.buildContext(cond, errorCode);
            }
            builderData.contexts = builder.contexts.getBuffer();
        }
        return cond->builtCE32;
    }
}